

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

bool __thiscall cmCTestSVN::NoteOldRevision(cmCTestSVN *this)

{
  pointer pSVar1;
  cmCTest *this_00;
  bool bVar2;
  ostream *poVar3;
  pointer svninfo;
  string *this_01;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar2 = LoadRepositories(this);
  if (bVar2) {
    svninfo = (this->Repositories).
              super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar1 = (this->Repositories).
             super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (svninfo != pSVar1) {
      do {
        LoadInfo_abi_cxx11_(local_1a8,this,svninfo);
        this_01 = &svninfo->OldRevision;
        std::__cxx11::string::operator=((string *)this_01,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Revision for repository \'",0x19)
        ;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(svninfo->LocalPath)._M_dataplus._M_p,
                            (svninfo->LocalPath)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' before update: ",0x11);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(this_01->_M_dataplus)._M_p,
                            (svninfo->OldRevision)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"   Old revision of external repository \'",0x28);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(svninfo->LocalPath)._M_dataplus._M_p,
                            (svninfo->LocalPath)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' is: ",6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(this_01->_M_dataplus)._M_p,
                            (svninfo->OldRevision)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestSVN.cxx"
                     ,0x73,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        svninfo = svninfo + 1;
      } while (svninfo != pSVar1);
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).OldRevision);
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  }
  return bVar2;
}

Assistant:

bool cmCTestSVN::NoteOldRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  std::vector<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::vector<SVNInfo>::iterator itend = this->Repositories.end();
  for (; itbeg != itend; itbeg++) {
    SVNInfo& svninfo = *itbeg;
    svninfo.OldRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' before update: " << svninfo.OldRevision << "\n";
    cmCTestLog(
      this->CTest, HANDLER_OUTPUT, "   Old revision of external repository '"
        << svninfo.LocalPath << "' is: " << svninfo.OldRevision << "\n");
  }

  // Set the global old revision to the one of the root
  this->OldRevision = this->RootInfo->OldRevision;
  this->PriorRev.Rev = this->OldRevision;
  return true;
}